

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O2

void sfd_tran_pipe_send_start(sfd_tran_pipe *p)

{
  nni_list *list;
  nni_aio *pnVar1;
  nni_msg *m;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  uint nio;
  undefined1 local_68 [8];
  nni_iov iov [3];
  
  list = &p->sendq;
  if (p->closed == true) {
    while (pnVar1 = (nni_aio *)nni_list_first(list), pnVar1 != (nni_aio *)0x0) {
      nni_list_remove(list,pnVar1);
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
  }
  else {
    pnVar1 = (nni_aio *)nni_list_first(list);
    if (pnVar1 != (nni_aio *)0x0) {
      m = nni_aio_get_msg(pnVar1);
      sVar2 = nni_msg_len(m);
      sVar3 = nni_msg_header_len(m);
      uVar4 = sVar3 + sVar2;
      local_68 = (undefined1  [8])p->txlen;
      *(ulong *)p->txlen =
           uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      iov[0].iov_buf = (void *)0x8;
      sVar2 = nni_msg_header_len(m);
      if (sVar2 == 0) {
        nio = 1;
      }
      else {
        iov[0].iov_len = (size_t)nni_msg_header(m);
        iov[1].iov_buf = (void *)nni_msg_header_len(m);
        nio = 2;
      }
      sVar2 = nni_msg_len(m);
      if (sVar2 != 0) {
        pvVar5 = nni_msg_body(m);
        *(void **)((long)iov + ((ulong)(nio << 4) - 8)) = pvVar5;
        sVar2 = nni_msg_len(m);
        *(size_t *)((long)&iov[0].iov_buf + (ulong)(nio << 4)) = sVar2;
        nio = nio + 1;
      }
      nni_aio_set_iov(&p->txaio,nio,(nni_iov *)local_68);
      nng_stream_send(p->conn,&p->txaio);
    }
  }
  return;
}

Assistant:

static void
sfd_tran_pipe_send_start(sfd_tran_pipe *p)
{
	nni_aio *aio;
	nni_aio *txaio;
	nni_msg *msg;
	int      niov;
	nni_iov  iov[3];
	uint64_t len;

	if (p->closed) {
		while ((aio = nni_list_first(&p->sendq)) != NULL) {
			nni_list_remove(&p->sendq, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}

	if ((aio = nni_list_first(&p->sendq)) == NULL) {
		return;
	}

	// This runs to send the message.
	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg) + nni_msg_header_len(msg);

	NNI_PUT64(p->txlen, len);

	txaio          = &p->txaio;
	niov           = 0;
	iov[0].iov_buf = p->txlen;
	iov[0].iov_len = sizeof(p->txlen);
	niov++;
	if (nni_msg_header_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_header(msg);
		iov[niov].iov_len = nni_msg_header_len(msg);
		niov++;
	}
	if (nni_msg_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_body(msg);
		iov[niov].iov_len = nni_msg_len(msg);
		niov++;
	}
	nni_aio_set_iov(txaio, niov, iov);
	nng_stream_send(p->conn, txaio);
}